

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

void __thiscall cmCTestBZR::LogParser::InitializeParser(LogParser *this)

{
  InitializeParser((LogParser *)(this[-1].EmailRegex.regmatch.endp + 0x1e));
  return;
}

Assistant:

int InitializeParser() override
  {
    int res = this->cmXMLParser::InitializeParser();
    if (res) {
      XML_SetUnknownEncodingHandler(static_cast<XML_Parser>(this->Parser),
                                    cmBZRXMLParserUnknownEncodingHandler,
                                    nullptr);
    }
    return res;
  }